

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool Js::FunctionProxy::SetDisplayName
               (char16 *srcName,WriteBarrierPtr<const_char16_t> *destName,uint displayNameLength,
               ScriptContext *scriptContext,SetDisplayNameFlags flags)

{
  bool bVar1;
  char16_t *pcStack_38;
  bool targetIsRecyclerMemory;
  char16 *dest;
  ScriptContext *pSStack_28;
  SetDisplayNameFlags flags_local;
  ScriptContext *scriptContext_local;
  WriteBarrierPtr<const_char16_t> *pWStack_18;
  uint displayNameLength_local;
  WriteBarrierPtr<const_char16_t> *destName_local;
  char16 *srcName_local;
  
  pcStack_38 = (char16_t *)0x0;
  dest._4_4_ = flags;
  pSStack_28 = scriptContext;
  scriptContext_local._4_4_ = displayNameLength;
  pWStack_18 = destName;
  destName_local = (WriteBarrierPtr<const_char16_t> *)srcName;
  bVar1 = SetDisplayName(srcName,&stack0xffffffffffffffc8,displayNameLength,scriptContext,flags);
  if (bVar1) {
    Memory::WriteBarrierPtr<const_char16_t>::operator=(pWStack_18,pcStack_38);
  }
  else {
    Memory::WriteBarrierPtr<const_char16_t>::NoWriteBarrierSet(pWStack_18,pcStack_38);
  }
  return bVar1;
}

Assistant:

bool FunctionProxy::SetDisplayName(const char16* srcName, WriteBarrierPtr<const char16>* destName, uint displayNameLength, ScriptContext * scriptContext, SetDisplayNameFlags flags /* default to None */)
    {
        const char16* dest = nullptr;
        bool targetIsRecyclerMemory = SetDisplayName(srcName, &dest, displayNameLength, scriptContext, flags);

        if (targetIsRecyclerMemory)
        {
            *destName = dest;
        }
        else
        {
            destName->NoWriteBarrierSet(dest);
        }
        return targetIsRecyclerMemory;
    }